

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

stbi_uc * tga_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc sVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  stbi_uc *psVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint *puVar13;
  undefined4 in_register_00000084;
  undefined8 uVar14;
  int *piVar15;
  int *piVar16;
  ulong __n;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  uchar raw_data [4];
  undefined1 local_b0 [4];
  int local_ac;
  undefined8 local_a8;
  stbi_uc *local_a0;
  uint local_98;
  int local_94;
  int *local_90;
  int *local_88;
  undefined8 local_80;
  uint *local_78;
  int local_6c;
  ulong local_68;
  ulong local_60;
  stbi_uc *local_58;
  ulong local_50;
  ulong local_48;
  int local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_60 = CONCAT44(in_register_00000084,req_comp);
  local_90 = x;
  local_88 = y;
  local_78 = (uint *)comp;
  iVar2 = get8(s);
  local_48 = CONCAT44(local_48._4_4_,iVar2);
  local_94 = get8(s);
  uVar3 = get8(s);
  local_98 = get8(s);
  iVar2 = get8(s);
  local_50 = CONCAT44(local_50._4_4_,iVar2);
  iVar2 = get8(s);
  local_80 = CONCAT44(local_80._4_4_,iVar2);
  local_ac = get8(s);
  local_a8._0_4_ = get8(s);
  local_a8._4_4_ = extraout_var;
  get8(s);
  get8(s);
  get8(s);
  get8(s);
  iVar2 = get8(s);
  iVar4 = get8(s);
  iVar2 = iVar4 * 0x100 + iVar2;
  iVar4 = get8(s);
  iVar5 = get8(s);
  iVar6 = get8(s);
  local_68 = CONCAT44(extraout_var_00,iVar6);
  local_3c = get8(s);
  uVar7 = (uVar3 & 0xff) - 8;
  if ((uVar3 & 0xf8) == 0) {
    uVar7 = uVar3 & 0xff;
  }
  local_a0 = (stbi_uc *)0x0;
  if (((0 < iVar2) && (iVar4 = iVar5 * 0x100 + iVar4, 0 < iVar4)) && (0xfffffffc < uVar7 - 4)) {
    if ((byte)((char)local_68 << 5 | (byte)((char)local_68 - 8U) >> 3) < 4) {
      uVar9 = (uint)local_48 & 0xff;
      local_ac = local_ac << 8;
      uVar18 = (uint)local_a8 & 0xff;
      uVar7 = (uint)local_68 & 0xff;
      if ((char)local_94 != '\0') {
        uVar7 = uVar18;
      }
      *local_90 = iVar2;
      *local_88 = iVar4;
      local_38 = uVar7 >> 3;
      uVar17 = local_60 & 0xffffffff;
      if ((int)local_60 - 5U < 0xfffffffc) {
        uVar17 = (ulong)local_38;
      }
      *local_78 = local_38;
      local_a8 = CONCAT44(local_a8._4_4_,iVar4 * iVar2);
      local_6c = iVar2;
      local_34 = uVar3;
      local_a0 = (stbi_uc *)malloc((ulong)(uint)((int)uVar17 * iVar4 * iVar2));
      if ((FILE *)s->img_file == (FILE *)0x0) {
        s->img_buffer = s->img_buffer + uVar9;
      }
      else {
        fseek((FILE *)s->img_file,(ulong)uVar9,1);
      }
      local_ac = local_ac + (int)local_80;
      local_40 = iVar4;
      if ((char)local_94 == '\0') {
        local_58 = (stbi_uc *)0x0;
      }
      else {
        lVar12 = (long)(int)((int)local_50 * 0x100 + local_98);
        if ((FILE *)s->img_file == (FILE *)0x0) {
          s->img_buffer = s->img_buffer + lVar12;
        }
        else {
          fseek((FILE *)s->img_file,lVar12,1);
        }
        iVar4 = uVar18 * local_ac;
        iVar2 = iVar4 + 7;
        if (-1 < iVar4) {
          iVar2 = iVar4;
        }
        local_58 = (stbi_uc *)malloc((long)(iVar2 >> 3));
        getn(s,local_58,iVar2 >> 3);
      }
      local_98 = uVar7 << 0x1d | uVar7 - 8 >> 3;
      __n = (ulong)((uVar7 - 1 >> 3) + 1);
      local_48 = local_a8 & 0xffffffff;
      bVar20 = true;
      local_50 = (ulong)local_98;
      uVar11 = 0;
      local_a8 = local_a8 & 0xffffffff00000000;
      iVar2 = 0;
      uVar14 = 0;
      piVar15 = (int *)0x0;
      piVar16 = (int *)0x0;
      puVar13 = (uint *)0x0;
      local_68 = (ulong)uVar7;
      local_60 = uVar17;
      do {
        if ((local_34 & 0xf8) == 0) {
LAB_0014c55b:
          local_78 = puVar13;
          local_80 = uVar14;
          local_88 = piVar15;
          local_90 = piVar16;
          if ((char)local_94 == '\0') {
            if ((int)local_68 != 0) {
              uVar10 = 0;
              do {
                iVar4 = get8(s);
                local_b0[uVar10] = (char)iVar4;
                uVar10 = uVar10 + 1;
              } while (__n != uVar10);
            }
          }
          else {
            uVar7 = get8(s);
            if ((int)local_68 != 0) {
              uVar3 = uVar7 & 0xff;
              if (local_ac <= (int)(uVar7 & 0xff)) {
                uVar3 = 0;
              }
              memcpy(local_b0,local_58 + uVar3 * local_38,__n);
            }
          }
          puVar13 = local_78;
          uVar14 = local_80;
          piVar15 = local_88;
          piVar16 = local_90;
          if (local_98 < 4) {
            psVar8 = (stbi_uc *)
                     (*(code *)(&DAT_00185254 + *(int *)(&DAT_00185254 + local_50 * 4)))();
            return psVar8;
          }
        }
        else {
          if (iVar2 == 0) {
            local_90 = piVar16;
            local_88 = piVar15;
            local_80 = uVar14;
            local_78 = puVar13;
            uVar7 = get8(s);
            iVar2 = (uVar7 & 0x7f) + 1;
            local_a8 = CONCAT44(local_a8._4_4_,uVar7 >> 7) & 0xffffffff00000001;
            piVar16 = local_90;
            piVar15 = local_88;
            uVar14 = local_80;
            puVar13 = local_78;
            goto LAB_0014c55b;
          }
          bVar19 = (uint)local_a8 != 0;
          local_a8 = CONCAT44(local_a8._4_4_,1);
          if (!bVar19 || bVar20) {
            local_a8 = CONCAT44(local_a8._4_4_,(uint)bVar19);
            goto LAB_0014c55b;
          }
        }
        switch((int)uVar17) {
        case 1:
          local_a0[uVar11] =
               (stbi_uc)(((uint)piVar15 & 0xff) * 0x1d +
                         ((uint)piVar16 & 0xff) * 0x96 + ((uint)puVar13 & 0xff) * 0x4d >> 8);
          break;
        case 2:
          local_a0[uVar11 * 2] =
               (stbi_uc)(((uint)piVar15 & 0xff) * 0x1d +
                         ((uint)piVar16 & 0xff) * 0x96 + ((uint)puVar13 & 0xff) * 0x4d >> 8);
          local_a0[uVar11 * 2 + 1] = (stbi_uc)uVar14;
          break;
        case 3:
          lVar12 = uVar11 * 3;
          local_a0[lVar12] = (stbi_uc)puVar13;
          local_a0[lVar12 + 1] = (stbi_uc)piVar16;
          local_a0[lVar12 + 2] = (stbi_uc)piVar15;
          break;
        case 4:
          local_a0[uVar11 * 4] = (stbi_uc)puVar13;
          local_a0[uVar11 * 4 + 1] = (stbi_uc)piVar16;
          local_a0[uVar11 * 4 + 2] = (stbi_uc)piVar15;
          local_a0[uVar11 * 4 + 3] = (stbi_uc)uVar14;
        }
        iVar2 = iVar2 + -1;
        uVar11 = uVar11 + 1;
        bVar20 = false;
      } while (uVar11 != local_48);
      if ((local_3c & 0x20) == 0) {
        iVar4 = (int)local_60 * local_6c;
        iVar2 = iVar4 * (local_40 - 1U);
        uVar3 = 0;
        uVar7 = 0;
        do {
          if (0 < iVar4) {
            psVar8 = local_a0;
            uVar9 = iVar4 + 1;
            do {
              sVar1 = psVar8[uVar3];
              psVar8[uVar3] = psVar8[iVar2];
              psVar8[iVar2] = sVar1;
              psVar8 = psVar8 + 1;
              uVar9 = uVar9 - 1;
            } while (1 < uVar9);
          }
          iVar2 = iVar2 - iVar4;
          uVar3 = uVar3 + iVar4;
          bVar20 = uVar7 != local_40 - 1U >> 1;
          uVar7 = uVar7 + 1;
        } while (bVar20);
      }
      if (local_58 != (stbi_uc *)0x0) {
        free(local_58);
      }
    }
    else {
      local_a0 = (stbi_uc *)0x0;
    }
  }
  return local_a0;
}

Assistant:

static stbi_uc *tga_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	//	read in the TGA header stuff
	int tga_offset = get8u(s);
	int tga_indexed = get8u(s);
	int tga_image_type = get8u(s);
	int tga_is_RLE = 0;
	int tga_palette_start = get16le(s);
	int tga_palette_len = get16le(s);
	int tga_palette_bits = get8u(s);
	int tga_x_origin = get16le(s);
	int tga_y_origin = get16le(s);
	int tga_width = get16le(s);
	int tga_height = get16le(s);
	int tga_bits_per_pixel = get8u(s);
	int tga_inverted = get8u(s);
	//	image data
	unsigned char *tga_data;
	unsigned char *tga_palette = NULL;
	int i, j;
	unsigned char raw_data[4];
	unsigned char trans_data[] = { 0,0,0,0 };
	int RLE_count = 0;
	int RLE_repeating = 0;
	int read_next_pixel = 1;
	//	do a tiny bit of precessing
	if( tga_image_type >= 8 )
	{
		tga_image_type -= 8;
		tga_is_RLE = 1;
	}
	/* int tga_alpha_bits = tga_inverted & 15; */
	tga_inverted = 1 - ((tga_inverted >> 5) & 1);

	//	error check
	if( //(tga_indexed) ||
		(tga_width < 1) || (tga_height < 1) ||
		(tga_image_type < 1) || (tga_image_type > 3) ||
		((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16) &&
		(tga_bits_per_pixel != 24) && (tga_bits_per_pixel != 32))
		)
	{
		return NULL;
	}

	//	If I'm paletted, then I'll use the number of bits from the palette
	if( tga_indexed )
	{
		tga_bits_per_pixel = tga_palette_bits;
	}

	//	tga info
	*x = tga_width;
	*y = tga_height;
	if( (req_comp < 1) || (req_comp > 4) )
	{
		//	just use whatever the file was
		req_comp = tga_bits_per_pixel / 8;
		*comp = req_comp;
	} else
	{
		//	force a new number of components
		*comp = tga_bits_per_pixel/8;
	}
	tga_data = (unsigned char*)malloc( tga_width * tga_height * req_comp );

	//	skip to the data's starting position (offset usually = 0)
	skip(s, tga_offset );
	//	do I need to load a palette?
	if( tga_indexed )
	{
		//	any data to skip? (offset usually = 0)
		skip(s, tga_palette_start );
		//	load the palette
		tga_palette = (unsigned char*)malloc( tga_palette_len * tga_palette_bits / 8 );
		getn(s, tga_palette, tga_palette_len * tga_palette_bits / 8 );
	}
	//	load the data
	for( i = 0; i < tga_width * tga_height; ++i )
	{
		//	if I'm in RLE mode, do I need to get a RLE chunk?
		if( tga_is_RLE )
		{
			if( RLE_count == 0 )
			{
				//	yep, get the next byte as a RLE command
				int RLE_cmd = get8u(s);
				RLE_count = 1 + (RLE_cmd & 127);
				RLE_repeating = RLE_cmd >> 7;
				read_next_pixel = 1;
			} else if( !RLE_repeating )
			{
				read_next_pixel = 1;
			}
		} else
		{
			read_next_pixel = 1;
		}
		//	OK, if I need to read a pixel, do it now
		if( read_next_pixel )
		{
			//	load however much data we did have
			if( tga_indexed )
			{
				//	read in 1 byte, then perform the lookup
				int pal_idx = get8u(s);
				if( pal_idx >= tga_palette_len )
				{
					//	invalid index
					pal_idx = 0;
				}
				pal_idx *= tga_bits_per_pixel / 8;
				for( j = 0; j*8 < tga_bits_per_pixel; ++j )
				{
					raw_data[j] = tga_palette[pal_idx+j];
				}
			} else
			{
				//	read in the data raw
				for( j = 0; j*8 < tga_bits_per_pixel; ++j )
				{
					raw_data[j] = get8u(s);
				}
			}
			//	convert raw to the intermediate format
			switch( tga_bits_per_pixel )
			{
			case 8:
				//	Luminous => RGBA
				trans_data[0] = raw_data[0];
				trans_data[1] = raw_data[0];
				trans_data[2] = raw_data[0];
				trans_data[3] = 255;
				break;
			case 16:
				//	Luminous,Alpha => RGBA
				trans_data[0] = raw_data[0];
				trans_data[1] = raw_data[0];
				trans_data[2] = raw_data[0];
				trans_data[3] = raw_data[1];
				break;
			case 24:
				//	BGR => RGBA
				trans_data[0] = raw_data[2];
				trans_data[1] = raw_data[1];
				trans_data[2] = raw_data[0];
				trans_data[3] = 255;
				break;
			case 32:
				//	BGRA => RGBA
				trans_data[0] = raw_data[2];
				trans_data[1] = raw_data[1];
				trans_data[2] = raw_data[0];
				trans_data[3] = raw_data[3];
				break;
			}
			//	clear the reading flag for the next pixel
			read_next_pixel = 0;
		} // end of reading a pixel
		//	convert to final format
		switch( req_comp )
		{
		case 1:
			//	RGBA => Luminance
			tga_data[i*req_comp+0] = compute_y(trans_data[0],trans_data[1],trans_data[2]);
			break;
		case 2:
			//	RGBA => Luminance,Alpha
			tga_data[i*req_comp+0] = compute_y(trans_data[0],trans_data[1],trans_data[2]);
			tga_data[i*req_comp+1] = trans_data[3];
			break;
		case 3:
			//	RGBA => RGB
			tga_data[i*req_comp+0] = trans_data[0];
			tga_data[i*req_comp+1] = trans_data[1];
			tga_data[i*req_comp+2] = trans_data[2];
			break;
		case 4:
			//	RGBA => RGBA
			tga_data[i*req_comp+0] = trans_data[0];
			tga_data[i*req_comp+1] = trans_data[1];
			tga_data[i*req_comp+2] = trans_data[2];
			tga_data[i*req_comp+3] = trans_data[3];
			break;
		}
		//	in case we're in RLE mode, keep counting down
		--RLE_count;
	}
	//	do I need to invert the image?
	if( tga_inverted )
	{
		for( j = 0; j*2 < tga_height; ++j )
		{
			int index1 = j * tga_width * req_comp;
			int index2 = (tga_height - 1 - j) * tga_width * req_comp;
			for( i = tga_width * req_comp; i > 0; --i )
			{
				unsigned char temp = tga_data[index1];
				tga_data[index1] = tga_data[index2];
				tga_data[index2] = temp;
				++index1;
				++index2;
			}
		}
	}
	//	clear my palette, if I had one
	if( tga_palette != NULL )
	{
		free( tga_palette );
	}
	//	the things I do to get rid of an error message, and yet keep
	//	Microsoft's C compilers happy... [8^(
	tga_palette_start = tga_palette_len = tga_palette_bits =
			tga_x_origin = tga_y_origin = 0;
	//	OK, done
	return tga_data;
}